

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O0

vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
* ising::dos::square::finite<128u,100u,int>(uint_t m,uint_t n)

{
  byte bVar1;
  undefined4 *puVar2;
  ulong in_RDX;
  ulong in_RSI;
  __normal_iterator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_*,_std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>_>
  in_RDI;
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  sum;
  uint i;
  promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
  zmn;
  uint j;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  v;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  ak;
  uint k;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  z4;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  z3;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  z2;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  z1;
  promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
  sn;
  promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
  cn;
  promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
  s0;
  promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
  c0;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  beta_m;
  promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
  beta;
  autodiff_fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>,_128UL>
  xmo;
  autodiff_fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>,_128UL>
  xpo;
  autodiff_fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>,_128UL>
  x;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  *dos;
  undefined7 in_stack_fffffffffff6aa38;
  undefined1 in_stack_fffffffffff6aa3f;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  *in_stack_fffffffffff6aa40;
  undefined1 *puVar3;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  *in_stack_fffffffffff6aa48;
  undefined1 *i_00;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffff6aa50;
  data_type *this;
  data_type *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_fffffffffff6aa58;
  data_type *__init;
  uint n_00;
  __normal_iterator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_*,_std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>_>
  __first;
  undefined4 in_stack_fffffffffff6aa70;
  undefined4 in_stack_fffffffffff6aa74;
  undefined1 auStack_95588 [8];
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  *in_stack_fffffffffff6aa80;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  *in_stack_fffffffffff6aa88;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  *in_stack_fffffffffff6aa98;
  undefined4 uStack_9553c;
  data_type adStack_95538 [2];
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  *pnStack_95518;
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  *pnStack_95510;
  undefined8 uStack_954e0;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  *in_stack_fffffffffff6ab68;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  *in_stack_fffffffffff6ab70;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  *in_stack_fffffffffff6ab80;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  *in_stack_fffffffffff6ab88;
  uint uStack_953fc;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  *in_stack_fffffffffff6d2e8;
  undefined4 uStack_8db04;
  undefined1 auStack_8db00 [10184];
  uint in_stack_fffffffffff74cc8;
  uint in_stack_fffffffffff74ccc;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  *in_stack_fffffffffff74cd0;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  *in_stack_fffffffffff74cd8;
  undefined4 uStack_889c0;
  undefined1 auStack_889bc [20800];
  undefined4 uStack_8387c;
  undefined1 auStack_83878 [20800];
  undefined4 uStack_7e738;
  undefined1 auStack_7e734 [93120];
  uint uStack_67b74;
  uint uStack_62ad0;
  undefined4 uStack_62acc;
  undefined1 auStack_62ac8 [10400];
  undefined4 uStack_60228;
  undefined1 auStack_60224 [10400];
  undefined4 uStack_5d984;
  undefined1 auStack_5d980 [10400];
  undefined4 uStack_5b0e0;
  undefined1 auStack_5b0dc [10400];
  undefined4 uStack_5883c;
  undefined1 auStack_58838 [20720];
  undefined4 uStack_53748;
  undefined1 auStack_53744 [20720];
  undefined4 uStack_4e654;
  undefined1 auStack_4e650 [20720];
  undefined4 uStack_49560;
  undefined1 auStack_4955c [237440];
  undefined4 local_f5dc;
  undefined1 local_f5d8 [31040];
  undefined4 local_7c98;
  undefined1 local_7c94 [10400];
  undefined4 local_53f4;
  undefined1 local_53f0 [10400];
  undefined4 local_2b50;
  undefined1 local_2b4c [10400];
  int local_2ac;
  ulong local_2a8;
  ulong local_2a0;
  undefined8 local_290;
  undefined4 *local_288;
  undefined1 *local_280;
  undefined8 local_278;
  undefined4 *local_270;
  undefined1 *local_268;
  undefined8 local_260;
  undefined4 *local_258;
  undefined1 *local_250;
  undefined8 local_248;
  undefined4 *local_240;
  undefined1 *local_238;
  undefined8 local_230;
  undefined4 *local_228;
  undefined1 *local_220;
  undefined8 local_218;
  undefined4 *local_210;
  undefined1 *local_208;
  undefined8 local_200;
  undefined4 *local_1f8;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  undefined4 *local_1e0;
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined4 *local_1c8;
  undefined1 *local_1c0;
  undefined8 local_1b8;
  undefined4 *local_1b0;
  undefined1 *local_1a8;
  undefined8 local_1a0;
  undefined4 *local_198;
  undefined1 *local_190;
  undefined8 local_188;
  undefined4 *local_180;
  undefined1 *local_178;
  undefined8 local_170;
  undefined4 *local_168;
  undefined1 *local_160;
  undefined8 local_158;
  undefined4 *local_150;
  undefined1 *local_148;
  undefined8 local_140;
  undefined4 *local_138;
  undefined1 *local_130;
  undefined8 local_128;
  undefined4 *local_120;
  undefined1 *local_118;
  undefined8 local_110;
  undefined4 *local_108;
  data_type *local_100;
  undefined8 local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined4 *local_e0;
  undefined4 *local_d8;
  undefined4 *local_d0;
  undefined4 *local_c8;
  undefined4 *local_c0;
  undefined4 *local_b8;
  undefined4 *local_b0;
  undefined4 *local_a8;
  undefined4 *local_a0;
  undefined4 *local_98;
  undefined4 *local_90;
  undefined4 *local_88;
  undefined4 *local_80;
  undefined4 *local_78;
  undefined4 *local_70;
  undefined4 *local_68;
  undefined1 *local_60;
  undefined4 *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined1 *local_40;
  undefined8 local_38;
  undefined8 local_30;
  data_type *local_28;
  undefined8 local_20;
  data_type *local_18;
  undefined8 local_10;
  undefined1 *local_8;
  
  __first._M_current = in_RDI._M_current;
  local_2a8 = in_RDX;
  local_2a0 = in_RSI;
  local_2ac = (int)std::setprecision(0x80);
  std::operator<<((ostream *)&std::cout,(_Setprecision)local_2ac);
  local_2b50 = 0;
  local_280 = local_2b4c;
  local_288 = &local_2b50;
  local_290 = 0;
  local_68 = local_288;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (in_stack_fffffffffff6aa50,(longlong)in_stack_fffffffffff6aa48,in_stack_fffffffffff6aa40
            );
  boost::math::differentiation::autodiff_v1::
  make_fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
              *)CONCAT17(in_stack_fffffffffff6aa3f,in_stack_fffffffffff6aa38));
  local_53f4 = 0xffffffff;
  local_268 = local_53f0;
  local_270 = &local_53f4;
  local_278 = 0;
  local_70 = local_270;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (in_stack_fffffffffff6aa50,(longlong)in_stack_fffffffffff6aa48,in_stack_fffffffffff6aa40
            );
  boost::math::differentiation::autodiff_v1::
  make_fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
              *)CONCAT17(in_stack_fffffffffff6aa3f,in_stack_fffffffffff6aa38));
  local_7c98 = 1;
  local_250 = local_7c94;
  local_258 = &local_7c98;
  local_260 = 0;
  local_78 = local_258;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (in_stack_fffffffffff6aa50,(longlong)in_stack_fffffffffff6aa48,in_stack_fffffffffff6aa40
            );
  boost::math::differentiation::autodiff_v1::
  make_fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
              *)CONCAT17(in_stack_fffffffffff6aa3f,in_stack_fffffffffff6aa38));
  local_f5dc = 2;
  local_238 = local_f5d8;
  local_240 = &local_f5dc;
  local_248 = 0;
  local_80 = local_240;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (in_stack_fffffffffff6aa50,(longlong)in_stack_fffffffffff6aa48,in_stack_fffffffffff6aa40
            );
  boost::math::differentiation::autodiff_v1::detail::operator*
            ((root_type *)in_stack_fffffffffff6aa48,in_stack_fffffffffff6aa40);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator*(in_stack_fffffffffff6ab88,in_stack_fffffffffff6ab80);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator*(in_stack_fffffffffff6ab88,in_stack_fffffffffff6ab80);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            (in_stack_fffffffffff6aa48,(uint)((ulong)in_stack_fffffffffff6aa40 >> 0x20));
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            (in_stack_fffffffffff6aa48,(uint)((ulong)in_stack_fffffffffff6aa40 >> 0x20));
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator*(in_stack_fffffffffff6ab88,in_stack_fffffffffff6ab80);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            (in_stack_fffffffffff6aa48,(uint)((ulong)in_stack_fffffffffff6aa40 >> 0x20));
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator+(in_stack_fffffffffff6aa88,in_stack_fffffffffff6aa80);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            (in_stack_fffffffffff6aa48,(uint)((ulong)in_stack_fffffffffff6aa40 >> 0x20));
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator*(in_stack_fffffffffff6ab88,in_stack_fffffffffff6ab80);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            (in_stack_fffffffffff6aa48,(uint)((ulong)in_stack_fffffffffff6aa40 >> 0x20));
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator-(in_stack_fffffffffff6aa88,in_stack_fffffffffff6aa80);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            (in_stack_fffffffffff6aa48,(uint)((ulong)in_stack_fffffffffff6aa40 >> 0x20));
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator*(in_stack_fffffffffff6ab88,in_stack_fffffffffff6ab80);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            (in_stack_fffffffffff6aa48,(uint)((ulong)in_stack_fffffffffff6aa40 >> 0x20));
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator+(in_stack_fffffffffff6aa88,in_stack_fffffffffff6aa80);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            (in_stack_fffffffffff6aa48,(uint)((ulong)in_stack_fffffffffff6aa40 >> 0x20));
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator*(in_stack_fffffffffff6ab88,in_stack_fffffffffff6ab80);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            (in_stack_fffffffffff6aa48,(uint)((ulong)in_stack_fffffffffff6aa40 >> 0x20));
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator-(in_stack_fffffffffff6aa88,in_stack_fffffffffff6aa80);
  (anonymous_namespace)::
  zero<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            (in_stack_fffffffffff6aa98);
  (anonymous_namespace)::
  zero<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            (in_stack_fffffffffff6aa98);
  (anonymous_namespace)::
  zero<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            (in_stack_fffffffffff6aa98);
  (anonymous_namespace)::
  zero<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            (in_stack_fffffffffff6aa98);
  if ((local_2a8 & 1) == 0) {
    (anonymous_namespace)::
    one<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
              (in_stack_fffffffffff6d2e8);
    uStack_49560 = 2;
    local_220 = auStack_4955c;
    local_228 = &uStack_49560;
    local_230 = 0;
    local_88 = local_228;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (in_stack_fffffffffff6aa50,(longlong)in_stack_fffffffffff6aa48,
               in_stack_fffffffffff6aa40);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator/(in_stack_fffffffffff6aa48,(root_type *)in_stack_fffffffffff6aa40);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator=(in_stack_fffffffffff6aa40,
                (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                 *)CONCAT17(in_stack_fffffffffff6aa3f,in_stack_fffffffffff6aa38));
    (anonymous_namespace)::
    one<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
              (in_stack_fffffffffff6d2e8);
    uStack_4e654 = 2;
    local_208 = auStack_4e650;
    local_210 = &uStack_4e654;
    local_218 = 0;
    local_90 = local_210;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (in_stack_fffffffffff6aa50,(longlong)in_stack_fffffffffff6aa48,
               in_stack_fffffffffff6aa40);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator/(in_stack_fffffffffff6aa48,(root_type *)in_stack_fffffffffff6aa40);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator=(in_stack_fffffffffff6aa40,
                (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                 *)CONCAT17(in_stack_fffffffffff6aa3f,in_stack_fffffffffff6aa38));
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
    ::operator*(in_stack_fffffffffff6ab88,in_stack_fffffffffff6ab80);
    uStack_53748 = 2;
    local_1f0 = auStack_53744;
    local_1f8 = &uStack_53748;
    local_200 = 0;
    local_98 = local_1f8;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (in_stack_fffffffffff6aa50,(longlong)in_stack_fffffffffff6aa48,
               in_stack_fffffffffff6aa40);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator/(in_stack_fffffffffff6aa48,(root_type *)in_stack_fffffffffff6aa40);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator=(in_stack_fffffffffff6aa40,
                (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                 *)CONCAT17(in_stack_fffffffffff6aa3f,in_stack_fffffffffff6aa38));
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
    ::operator*(in_stack_fffffffffff6ab88,in_stack_fffffffffff6ab80);
    uStack_5883c = 2;
    local_1d8 = auStack_58838;
    local_1e0 = &uStack_5883c;
    local_1e8 = 0;
    local_a0 = local_1e0;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (in_stack_fffffffffff6aa50,(longlong)in_stack_fffffffffff6aa48,
               in_stack_fffffffffff6aa40);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator/(in_stack_fffffffffff6aa48,(root_type *)in_stack_fffffffffff6aa40);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator=(in_stack_fffffffffff6aa40,
                (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                 *)CONCAT17(in_stack_fffffffffff6aa3f,in_stack_fffffffffff6aa38));
  }
  else {
    uStack_5b0e0 = 2;
    local_1c0 = auStack_5b0dc;
    local_1c8 = &uStack_5b0e0;
    local_1d0 = 0;
    local_a8 = local_1c8;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (in_stack_fffffffffff6aa50,(longlong)in_stack_fffffffffff6aa48,
               in_stack_fffffffffff6aa40);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator/(in_stack_fffffffffff6aa48,(root_type *)in_stack_fffffffffff6aa40);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator=(in_stack_fffffffffff6aa40,
                (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                 *)CONCAT17(in_stack_fffffffffff6aa3f,in_stack_fffffffffff6aa38));
    uStack_5d984 = 2;
    local_1a8 = auStack_5d980;
    local_1b0 = &uStack_5d984;
    local_1b8 = 0;
    local_b0 = local_1b0;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (in_stack_fffffffffff6aa50,(longlong)in_stack_fffffffffff6aa48,
               in_stack_fffffffffff6aa40);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator/(in_stack_fffffffffff6aa48,(root_type *)in_stack_fffffffffff6aa40);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator=(in_stack_fffffffffff6aa40,
                (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                 *)CONCAT17(in_stack_fffffffffff6aa3f,in_stack_fffffffffff6aa38));
    uStack_60228 = 2;
    local_190 = auStack_60224;
    local_198 = &uStack_60228;
    local_1a0 = 0;
    local_b8 = local_198;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (in_stack_fffffffffff6aa50,(longlong)in_stack_fffffffffff6aa48,
               in_stack_fffffffffff6aa40);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator/(in_stack_fffffffffff6aa48,(root_type *)in_stack_fffffffffff6aa40);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator=(in_stack_fffffffffff6aa40,
                (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                 *)CONCAT17(in_stack_fffffffffff6aa3f,in_stack_fffffffffff6aa38));
    uStack_62acc = 2;
    local_178 = auStack_62ac8;
    local_180 = &uStack_62acc;
    local_188 = 0;
    local_c0 = local_180;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (in_stack_fffffffffff6aa50,(longlong)in_stack_fffffffffff6aa48,
               in_stack_fffffffffff6aa40);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator/(in_stack_fffffffffff6aa48,(root_type *)in_stack_fffffffffff6aa40);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator=(in_stack_fffffffffff6aa40,
                (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                 *)CONCAT17(in_stack_fffffffffff6aa3f,in_stack_fffffffffff6aa38));
  }
  for (uStack_62ad0 = 1; uStack_62ad0 < local_2a8; uStack_62ad0 = uStack_62ad0 + 1) {
    (anonymous_namespace)::
    alpha<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
              (in_stack_fffffffffff74cd8,in_stack_fffffffffff74cd0,in_stack_fffffffffff74ccc,
               in_stack_fffffffffff74cc8);
    (anonymous_namespace)::
    zero<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
              (in_stack_fffffffffff6aa98);
    for (uStack_67b74 = 0; uStack_67b74 <= local_2a0; uStack_67b74 = uStack_67b74 + 2) {
      boost::math::
      binomial_coefficient<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                ((uint)((ulong)in_stack_fffffffffff6aa48 >> 0x20),(uint)in_stack_fffffffffff6aa48);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
      ::operator*(in_stack_fffffffffff6ab88,in_stack_fffffffffff6ab80);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
      ::operator*(in_stack_fffffffffff6ab88,in_stack_fffffffffff6ab80);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
      ::operator-(in_stack_fffffffffff6aa88,in_stack_fffffffffff6aa80);
      (anonymous_namespace)::
      power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
                (in_stack_fffffffffff6aa48,(uint)((ulong)in_stack_fffffffffff6aa40 >> 0x20));
      boost::math::differentiation::autodiff_v1::detail::operator*
                ((root_type *)in_stack_fffffffffff6aa48,in_stack_fffffffffff6aa40);
      (anonymous_namespace)::
      power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
                (in_stack_fffffffffff6aa48,(uint)((ulong)in_stack_fffffffffff6aa40 >> 0x20));
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
      ::operator*(in_stack_fffffffffff6ab88,in_stack_fffffffffff6ab80);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
      ::operator+=((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                    *)CONCAT44(in_stack_fffffffffff6aa74,in_stack_fffffffffff6aa70),
                   (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                    *)__first._M_current);
    }
    if ((uStack_62ad0 & 1) == 1) {
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
      ::operator+(in_stack_fffffffffff6aa88,in_stack_fffffffffff6aa80);
      uStack_7e738 = 2;
      local_160 = auStack_7e734;
      local_168 = &uStack_7e738;
      local_170 = 0;
      local_c8 = local_168;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (in_stack_fffffffffff6aa50,(longlong)in_stack_fffffffffff6aa48,
                 in_stack_fffffffffff6aa40);
      (anonymous_namespace)::
      power_n<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)in_stack_fffffffffff6aa48,(uint)((ulong)in_stack_fffffffffff6aa40 >> 0x20));
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
      ::operator/(in_stack_fffffffffff6aa48,(root_type *)in_stack_fffffffffff6aa40);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
      ::operator*=(in_stack_fffffffffff6ab70,in_stack_fffffffffff6ab68);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
      ::operator-(in_stack_fffffffffff6aa88,in_stack_fffffffffff6aa80);
      uStack_8387c = 2;
      local_148 = auStack_83878;
      local_150 = &uStack_8387c;
      local_158 = 0;
      local_d0 = local_150;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (in_stack_fffffffffff6aa50,(longlong)in_stack_fffffffffff6aa48,
                 in_stack_fffffffffff6aa40);
      (anonymous_namespace)::
      power_n<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)in_stack_fffffffffff6aa48,(uint)((ulong)in_stack_fffffffffff6aa40 >> 0x20));
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
      ::operator/(in_stack_fffffffffff6aa48,(root_type *)in_stack_fffffffffff6aa40);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
      ::operator*=(in_stack_fffffffffff6ab70,in_stack_fffffffffff6ab68);
    }
    else {
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
      ::operator+(in_stack_fffffffffff6aa88,in_stack_fffffffffff6aa80);
      uStack_889c0 = 2;
      local_130 = auStack_889bc;
      local_138 = &uStack_889c0;
      local_140 = 0;
      local_d8 = local_138;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (in_stack_fffffffffff6aa50,(longlong)in_stack_fffffffffff6aa48,
                 in_stack_fffffffffff6aa40);
      (anonymous_namespace)::
      power_n<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)in_stack_fffffffffff6aa48,(uint)((ulong)in_stack_fffffffffff6aa40 >> 0x20));
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
      ::operator/(in_stack_fffffffffff6aa48,(root_type *)in_stack_fffffffffff6aa40);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
      ::operator*=(in_stack_fffffffffff6ab70,in_stack_fffffffffff6ab68);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
      ::operator-(in_stack_fffffffffff6aa88,in_stack_fffffffffff6aa80);
      uStack_8db04 = 2;
      local_118 = auStack_8db00;
      local_120 = &uStack_8db04;
      local_128 = 0;
      local_e0 = local_120;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (in_stack_fffffffffff6aa50,(longlong)in_stack_fffffffffff6aa48,
                 in_stack_fffffffffff6aa40);
      (anonymous_namespace)::
      power_n<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)in_stack_fffffffffff6aa48,(uint)((ulong)in_stack_fffffffffff6aa40 >> 0x20));
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
      ::operator/(in_stack_fffffffffff6aa48,(root_type *)in_stack_fffffffffff6aa40);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
      ::operator*=(in_stack_fffffffffff6ab70,in_stack_fffffffffff6ab68);
    }
  }
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator+(in_stack_fffffffffff6aa88,in_stack_fffffffffff6aa80);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator+(in_stack_fffffffffff6aa88,in_stack_fffffffffff6aa80);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator+(in_stack_fffffffffff6aa88,in_stack_fffffffffff6aa80);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
            *)0x10b2f4);
  for (uStack_953fc = 0; (ulong)uStack_953fc <= local_2a0 * 2 * local_2a8;
      uStack_953fc = uStack_953fc + 1) {
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::at<>(in_stack_fffffffffff6aa48,(size_t)in_stack_fffffffffff6aa40);
    uStack_954e0 = 0x3f847ae147ae147b;
    boost::multiprecision::operator+(in_stack_fffffffffff6aa58,(double *)in_stack_fffffffffff6aa50);
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
    ::
    number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
              ((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                *)CONCAT44(in_stack_fffffffffff6aa74,in_stack_fffffffffff6aa70),
               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)__first._M_current,in_RDI._M_current);
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
    ::push_back((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 *)in_stack_fffffffffff6aa40,
                (value_type *)CONCAT17(in_stack_fffffffffff6aa3f,in_stack_fffffffffff6aa38));
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x10b3b0);
  }
  pnStack_95510 =
       (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
        *)std::
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
          ::begin((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                   *)CONCAT17(in_stack_fffffffffff6aa3f,in_stack_fffffffffff6aa38));
  pnStack_95518 =
       (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
        *)std::
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
          ::end((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 *)CONCAT17(in_stack_fffffffffff6aa3f,in_stack_fffffffffff6aa38));
  uStack_9553c = 0;
  this = adStack_95538;
  local_108 = &uStack_9553c;
  local_110 = 0;
  local_30 = 0;
  local_38 = 0;
  __init = this;
  local_100 = this;
  local_58 = local_108;
  local_28 = this;
  local_20 = local_30;
  local_18 = this;
  boost::empty_::empty_value<std::allocator<unsigned_long_long>,_0U,_true>::empty_value
            ((empty_value<std::allocator<unsigned_long_long>,_0U,_true> *)0x10b4d6);
  boost::multiprecision::backends::
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  ::data_type::data_type(this,(signed_limb_type)in_stack_fffffffffff6aa48);
  this_00 = this;
  this[1].ld.capacity = 1;
  *(byte *)((long)this + 0x14) = (byte)((ulong)local_20 >> 0x3f);
  *(undefined1 *)((long)this + 0x15) = 1;
  *(undefined1 *)((long)this + 0x16) = 0;
  std::
  accumulate<__gnu_cxx::__normal_iterator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>*,std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>>>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
            (__first,in_RDI,
             (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
              *)&__init->ld);
  n_00 = (uint)((ulong)in_RDI._M_current >> 0x20);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x10b53c);
  puVar3 = auStack_95588;
  local_f0 = &stack0xfffffffffff6aa74;
  local_f8 = 0;
  local_48 = 2;
  local_50 = 0;
  i_00 = puVar3;
  local_e8 = puVar3;
  local_60 = local_f0;
  local_40 = puVar3;
  local_10 = local_48;
  local_8 = puVar3;
  boost::empty_::empty_value<std::allocator<unsigned_long_long>,_0U,_true>::empty_value
            ((empty_value<std::allocator<unsigned_long_long>,_0U,_true> *)0x10b5e0);
  boost::multiprecision::backends::
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  ::data_type::data_type(this_00,(signed_limb_type)i_00);
  *(undefined4 *)(puVar3 + 0x10) = 1;
  puVar3[0x14] = (byte)((ulong)local_10 >> 0x3f);
  puVar3[0x15] = 1;
  puVar3[0x16] = 0;
  (anonymous_namespace)::
  power_n<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
            (__first._M_current,n_00);
  bVar1 = boost::multiprecision::operator!=
                    ((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                      *)in_stack_fffffffffff6aa88,
                     (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                      *)in_stack_fffffffffff6aa80);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x10b659);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x10b663);
  if ((bVar1 & 1) != 0) {
    std::operator<<((ostream *)&std::cerr,"Error: result check failed\n");
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 0;
    __cxa_throw(puVar2,&int::typeinfo,0);
  }
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x10b73e);
  return (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
          *)__first._M_current;
}

Assistant:

std::vector<mp::cpp_int> finite(uint_t m, uint_t n) {
  typedef mp::number<mp::cpp_dec_float<Digits10, ExponentType>> real_type;
  std::cout << std::setprecision(std::numeric_limits<real_type>::max_digits10);

  auto const x = make_fvar<real_type, Order>(0);
  auto const xpo = make_fvar<real_type, Order>(-1);
  auto const xmo = make_fvar<real_type, Order>(+1);

  auto beta = 2 * x * xpo * xmo;
  auto beta_m = power_n(beta, m);
  auto c0 = power_n(xmo, m) + power_n(x * xpo, m);
  auto s0 = power_n(xmo, m) - power_n(x * xpo, m);
  auto cn = power_n(xpo, m) + power_n(x * xmo, m);
  auto sn = power_n(xpo, m) - power_n(x * xmo, m);

  auto z1 = zero(x);
  auto z2 = zero(x);
  auto z3 = zero(x);
  auto z4 = zero(x);
  if ((n & 1) == 0) {
    z1 = one(x) / 2;
    z2 = one(x) / 2;
    z3 = c0 * cn / 2;
    z4 = s0 * sn / 2;
  } else {
    z1 = cn / 2;
    z2 = sn / 2;
    z3 = c0 / 2;
    z4 = s0 / 2;
  }
  for (unsigned k = 1; k < n; ++k) {
    auto ak = alpha(x, beta, n, k);
    auto v = zero(x);
    for (unsigned j = 0; j <= m; j += 2)
      v += binomial_coefficient<real_type>(m, j)
        * power_n(ak * ak - beta * beta, j/2) * power_n(ak, m-j);
    if ((k & 1) == 1) {
      z1 *= (v + beta_m) / power_n(real_type(2), m - 1);
      z2 *= (v - beta_m) / power_n(real_type(2), m - 1);
    } else {
      z3 *= (v + beta_m) / power_n(real_type(2), m - 1);
      z4 *= (v - beta_m) / power_n(real_type(2), m - 1);
    }
  }
  auto zmn = z1 + z2 + z3 + z4;

  std::vector<int_type> dos;
  for (unsigned i = 0; i <= 2 * m * n; ++i) dos.push_back(int_type(zmn.at(i) + 0.01));
  auto sum = std::accumulate(dos.begin(), dos.end(), int_type(0));
  if (sum != power_n(int_type(2), m * n)) {
    std::cerr << "Error: result check failed\n";
    throw(0);
  }
  return dos;
}